

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::relu_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  type_conflict3 tVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar6;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  size_t i_1;
  size_t i;
  float *out;
  float *in;
  float *gi;
  ulong local_40;
  ulong local_38;
  long lVar5;
  
  iVar2 = (*in_RDX->_vptr_tensor[2])();
  iVar3 = (*in_RSI->_vptr_tensor[2])();
  iVar4 = (*in_RDI->_vptr_tensor[3])();
  lVar5 = CONCAT44(extraout_var_01,iVar4);
  tVar1 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RDX);
  if (tVar1) {
    for (local_38 = 0; sVar6 = tensor::size(in_RSI), local_38 < sVar6; local_38 = local_38 + 1) {
      if (*(float *)(CONCAT44(extraout_var_00,iVar3) + local_38 * 4) <= 0.0) {
        *(undefined4 *)(lVar5 + local_38 * 4) = 0;
      }
      else {
        *(undefined4 *)(lVar5 + local_38 * 4) =
             *(undefined4 *)(CONCAT44(extraout_var,iVar2) + local_38 * 4);
      }
    }
  }
  else {
    for (local_40 = 0; sVar6 = tensor::size(in_RSI), local_40 < sVar6; local_40 = local_40 + 1) {
      if (0.0 < *(float *)(CONCAT44(extraout_var_00,iVar3) + local_40 * 4)) {
        *(float *)(lVar5 + local_40 * 4) =
             *(float *)(CONCAT44(extraout_var,iVar2) + local_40 * 4) +
             *(float *)(lVar5 + local_40 * 4);
      }
    }
  }
  return;
}

Assistant:

void relu_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const float* gi = gradient_input.host();
            const float* in = dest.host();
            float* out = grad.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] = gi[i];
                    else
                        out[i] = 0;
                }
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] += gi[i];
                }
            }
        }